

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedTimeZone::getTimeZoneRules
          (RuleBasedTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  TimeZoneRule *pTVar3;
  int32_t finalCount;
  int32_t historicCount;
  int32_t idx;
  int32_t cnt;
  UErrorCode *status_local;
  int32_t *trscount_local;
  TimeZoneRule **trsrules_local;
  InitialTimeZoneRule **initial_local;
  RuleBasedTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    *initial = this->fInitialRule;
    historicCount = 0;
    if ((this->fHistoricRules != (UVector *)0x0) && (0 < *trscount)) {
      iVar2 = UVector::size(this->fHistoricRules);
      finalCount = 0;
      while (historicCount < *trscount && finalCount < iVar2) {
        pTVar3 = (TimeZoneRule *)UVector::elementAt(this->fHistoricRules,finalCount);
        trsrules[historicCount] = pTVar3;
        finalCount = finalCount + 1;
        historicCount = historicCount + 1;
      }
    }
    if ((this->fFinalRules != (UVector *)0x0) && (historicCount < *trscount)) {
      iVar2 = UVector::size(this->fFinalRules);
      finalCount = 0;
      while (historicCount < *trscount && finalCount < iVar2) {
        pTVar3 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,finalCount);
        trsrules[historicCount] = pTVar3;
        finalCount = finalCount + 1;
        historicCount = historicCount + 1;
      }
    }
    *trscount = historicCount;
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::getTimeZoneRules(const InitialTimeZoneRule*& initial,
                                    const TimeZoneRule* trsrules[],
                                    int32_t& trscount,
                                    UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    // Initial rule
    initial = fInitialRule;

    // Transition rules
    int32_t cnt = 0;
    int32_t idx;
    if (fHistoricRules != NULL && cnt < trscount) {
        int32_t historicCount = fHistoricRules->size();
        idx = 0;
        while (cnt < trscount && idx < historicCount) {
            trsrules[cnt++] = (const TimeZoneRule*)fHistoricRules->elementAt(idx++);
        }
    }
    if (fFinalRules != NULL && cnt < trscount) {
        int32_t finalCount = fFinalRules->size();
        idx = 0;
        while (cnt < trscount && idx < finalCount) {
            trsrules[cnt++] = (const TimeZoneRule*)fFinalRules->elementAt(idx++);
        }
    }
    // Set the result length
    trscount = cnt;
}